

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O3

void __thiscall
llm_graph_input_attn_cross::set_input(llm_graph_input_attn_cross *this,llama_ubatch *ubatch)

{
  uint uVar1;
  long lVar2;
  void *pvVar3;
  llama_cross *plVar4;
  pointer psVar5;
  _Base_ptr p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  char cVar10;
  long lVar11;
  _Base_ptr p_Var12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 uVar16;
  long lVar17;
  _Base_ptr p_Var18;
  _Base_ptr p_Var19;
  _Base_ptr p_Var20;
  ulong uVar21;
  int iVar23;
  undefined1 auVar22 [16];
  undefined4 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar29;
  long lVar26;
  
  if (this->cross_kq_mask == (ggml_tensor *)0x0) {
    return;
  }
  lVar2 = this->cross_kq_mask->ne[0];
  uVar1 = ubatch->n_tokens;
  uVar21 = (ulong)uVar1;
  cVar10 = ggml_backend_buffer_is_host();
  if (cVar10 == '\0') {
    pcVar13 = "ggml_backend_buffer_is_host(cross_kq_mask->buffer)";
    uVar16 = 0x209;
  }
  else {
    if (ubatch->equal_seqs != true) {
      lVar11 = (long)(int)uVar1;
      pvVar3 = this->cross_kq_mask->data;
      if (uVar21 != 0) {
        uVar14 = 0;
        do {
          if (0 < lVar2) {
            uVar1 = ubatch->n_seq_id[uVar14];
            plVar4 = this->cross;
            lVar17 = 0;
            do {
              uVar24 = 0xff800000;
              if (0 < (int)uVar1) {
                psVar5 = (plVar4->seq_ids_enc).
                         super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                p_Var12 = &psVar5[lVar17]._M_t._M_impl.super__Rb_tree_header._M_header;
                p_Var6 = *(_Base_ptr *)
                          ((long)&psVar5[lVar17]._M_t._M_impl.super__Rb_tree_header + 8);
                uVar15 = 0;
                uVar24 = 0xff800000;
                do {
                  p_Var20 = p_Var12;
                  if (p_Var6 != (_Base_ptr)0x0) {
                    iVar23 = ubatch->seq_id[uVar14][uVar15];
                    p_Var18 = p_Var12;
                    p_Var19 = p_Var6;
                    do {
                      if (iVar23 <= (int)p_Var19[1]._M_color) {
                        p_Var18 = p_Var19;
                      }
                      p_Var19 = (&p_Var19->_M_left)[(int)p_Var19[1]._M_color < iVar23];
                    } while (p_Var19 != (_Base_ptr)0x0);
                    if ((p_Var18 != p_Var12) &&
                       (p_Var20 = p_Var18, iVar23 < (int)p_Var18[1]._M_color)) {
                      p_Var20 = p_Var12;
                    }
                  }
                  if (p_Var20 != p_Var12) {
                    uVar24 = 0;
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar15 != uVar1);
              }
              *(undefined4 *)((long)pvVar3 + lVar17 * 4 + uVar14 * lVar2 * 4) = uVar24;
              lVar17 = lVar17 + 1;
            } while (lVar17 != lVar2);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar21);
      }
      auVar9 = _DAT_002350d0;
      auVar8 = _DAT_002350c0;
      auVar7 = _DAT_002350b0;
      uVar21 = uVar21 + 0x3f & 0xffffffffffffffc0;
      if ((long)uVar21 <= lVar11) {
        return;
      }
      lVar17 = lVar2 + -1;
      auVar22._8_4_ = (int)lVar17;
      auVar22._0_8_ = lVar17;
      auVar22._12_4_ = (int)((ulong)lVar17 >> 0x20);
      lVar17 = (long)pvVar3 + lVar2 * lVar11 * 4 + 0xc;
      auVar22 = auVar22 ^ _DAT_002350d0;
      do {
        if (0 < lVar2) {
          uVar14 = 0;
          auVar25 = auVar8;
          auVar27 = auVar7;
          do {
            auVar28 = auVar25 ^ auVar9;
            iVar23 = auVar22._4_4_;
            if ((bool)(~(auVar28._4_4_ == iVar23 && auVar22._0_4_ < auVar28._0_4_ ||
                        iVar23 < auVar28._4_4_) & 1)) {
              *(undefined4 *)(lVar17 + -0xc + uVar14 * 4) = 0xff800000;
            }
            if ((auVar28._12_4_ != auVar22._12_4_ || auVar28._8_4_ <= auVar22._8_4_) &&
                auVar28._12_4_ <= auVar22._12_4_) {
              *(undefined4 *)(lVar17 + -8 + uVar14 * 4) = 0xff800000;
            }
            auVar28 = auVar27 ^ auVar9;
            iVar29 = auVar28._4_4_;
            if (iVar29 <= iVar23 && (iVar29 != iVar23 || auVar28._0_4_ <= auVar22._0_4_)) {
              *(undefined4 *)(lVar17 + -4 + uVar14 * 4) = 0xff800000;
              *(undefined4 *)(lVar17 + uVar14 * 4) = 0xff800000;
            }
            uVar14 = uVar14 + 4;
            lVar26 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 4;
            auVar25._8_8_ = lVar26 + 4;
            lVar26 = auVar27._8_8_;
            auVar27._0_8_ = auVar27._0_8_ + 4;
            auVar27._8_8_ = lVar26 + 4;
          } while ((lVar2 + 3U & 0xfffffffffffffffc) != uVar14);
        }
        lVar11 = lVar11 + 1;
        lVar17 = lVar17 + lVar2 * 4;
      } while (lVar11 < (long)uVar21);
      return;
    }
    pcVar13 = "!ubatch->equal_seqs";
    uVar16 = 0x20a;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
             ,uVar16,"GGML_ASSERT(%s) failed",pcVar13);
}

Assistant:

void llm_graph_input_attn_cross::set_input(const llama_ubatch * ubatch) {
    if (cross_kq_mask) {
        const int64_t n_enc    = cross_kq_mask->ne[0];
        const int64_t n_tokens = ubatch->n_tokens;

        GGML_ASSERT(ggml_backend_buffer_is_host(cross_kq_mask->buffer));
        GGML_ASSERT(!ubatch->equal_seqs); // TODO: use ubatch->n_seqs instead of failing

        float * data = (float *) cross_kq_mask->data;

        for (int h = 0; h < 1; ++h) {
            for (int j = 0; j < n_tokens; ++j) {
                for (int i = 0; i < n_enc; ++i) {
                    float f = -INFINITY;
                    for (int s = 0; s < ubatch->n_seq_id[j]; ++s) {
                        const llama_seq_id seq_id = ubatch->seq_id[j][s];
                        if (cross->seq_ids_enc[i].find(seq_id) != cross->seq_ids_enc[i].end()) {
                            f = 0.0f;
                        }
                    }
                    data[h*(n_enc*n_tokens) + j*n_enc + i] = f;
                }
            }

            for (int i = n_tokens; i < GGML_PAD(n_tokens, GGML_KQ_MASK_PAD); ++i) {
                for (int j = 0; j < n_enc; ++j) {
                    data[h*(n_enc*n_tokens) + i*n_enc + j] = -INFINITY;
                }
            }
        }
    }
}